

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall google::LogMessage::SaveOrSendToLog(LogMessage *this)

{
  LogMessageData *pLVar1;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pLVar1 = this->data_;
  if ((pLVar1->field_6).sink_ != (LogSink *)0x0) {
    if ((pLVar1->num_chars_to_log_ == 0) ||
       (pLVar1->message_text_[pLVar1->num_chars_to_log_ - 1] != '\n')) {
      RawLog__(FATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
               ,0x76b,"Check %s failed: %s",
               "data_->num_chars_to_log_ > 0 && data_->message_text_[data_->num_chars_to_log_ - 1] == \'\\n\'"
               ,"");
    }
    pLVar1 = this->data_;
    this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              (pLVar1->field_6).sink_;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,pLVar1->message_text_ + pLVar1->num_prefix_chars_,
               pLVar1->message_text_ + pLVar1->num_prefix_chars_ +
               ~pLVar1->num_prefix_chars_ + pLVar1->num_chars_to_log_);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(this_00,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  SendToLog(this);
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  if (data_->outvec_ != nullptr) {
    RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
                   data_->message_text_[data_->num_chars_to_log_ - 1] == '\n',
               "");
    // Omit prefix of message and trailing newline when recording in outvec_.
    const char* start = data_->message_text_ + data_->num_prefix_chars_;
    size_t len = data_->num_chars_to_log_ - data_->num_prefix_chars_ - 1;
    data_->outvec_->push_back(string(start, len));
  } else {
    SendToLog();
  }
}